

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O1

void __thiscall dtc::fdt::device_tree::collect_names(device_tree *this)

{
  pointer pppVar1;
  node_path p;
  node_ptr local_48;
  node_ptr local_38;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_28;
  
  local_28.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<dtc::fdt::node>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<dtc::fdt::node>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&(this->node_names)._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::device_tree::node_path>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::device_tree::node_path>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&(this->node_paths)._M_h);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::device_tree::node_path>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::device_tree::node_path>_>_>
  ::_M_erase_at_end(&this->ordered_node_paths,
                    (this->ordered_node_paths).
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::device_tree::node_path>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::device_tree::node_path>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  pppVar1 = (this->cross_references).
            super__Vector_base<dtc::fdt::property_value_*,_std::allocator<dtc::fdt::property_value_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->cross_references).
      super__Vector_base<dtc::fdt::property_value_*,_std::allocator<dtc::fdt::property_value_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != pppVar1) {
    (this->cross_references).
    super__Vector_base<dtc::fdt::property_value_*,_std::allocator<dtc::fdt::property_value_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = pppVar1;
  }
  std::vector<dtc::fdt::device_tree::fixup,_std::allocator<dtc::fdt::device_tree::fixup>_>::
  _M_erase_at_end(&this->fixups,
                  (this->fixups).
                  super__Vector_base<dtc::fdt::device_tree::fixup,_std::allocator<dtc::fdt::device_tree::fixup>_>
                  ._M_impl.super__Vector_impl_data._M_start);
  local_38.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_38.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->root).super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_48.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->root).super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (local_48.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_48.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_48.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_48.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_48.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  collect_names_recursive(this,&local_38,&local_48,(node_path *)&local_28);
  if (local_48.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_38.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_28);
  return;
}

Assistant:

void
device_tree::collect_names()
{
	node_path p;
	node_names.clear();
	node_paths.clear();
	ordered_node_paths.clear();
	cross_references.clear();
	fixups.clear();
	collect_names_recursive(nullptr, root, p);
}